

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void xdgSurfaceHandleConfigure(void *userData,xdg_surface *surface,uint32_t serial)

{
  GLFWbool GVar1;
  float fVar2;
  float targetRatio;
  float aspectRatio;
  int height;
  int width;
  _GLFWwindow *window;
  uint32_t serial_local;
  xdg_surface *surface_local;
  void *userData_local;
  
  xdg_surface_ack_configure(surface,serial);
  if ((((*(int *)((long)userData + 0x370) != *(int *)((long)userData + 0x3b0)) &&
       (*(undefined4 *)((long)userData + 0x370) = *(undefined4 *)((long)userData + 0x3b0),
       *(int *)((long)userData + 0x370) == 0)) && (*(long *)((long)userData + 0x50) != 0)) &&
     (*(int *)((long)userData + 0x10) != 0)) {
    xdg_toplevel_set_minimized(*(xdg_toplevel **)((long)userData + 0x3c0));
  }
  if (*(int *)((long)userData + 0x36c) != *(int *)((long)userData + 0x3a8)) {
    *(undefined4 *)((long)userData + 0x36c) = *(undefined4 *)((long)userData + 0x3a8);
    _glfwInputWindowMaximize((_GLFWwindow *)userData,*(GLFWbool *)((long)userData + 0x36c));
  }
  *(undefined4 *)((long)userData + 0x374) = *(undefined4 *)((long)userData + 0x3b4);
  aspectRatio = *(float *)((long)userData + 0x3a0);
  targetRatio = *(float *)((long)userData + 0x3a4);
  if (((*(int *)((long)userData + 0x36c) == 0) && (*(int *)((long)userData + 0x374) == 0)) &&
     ((*(int *)((long)userData + 0x78) != -1 && (*(int *)((long)userData + 0x7c) != -1)))) {
    fVar2 = (float)*(int *)((long)userData + 0x78) / (float)*(int *)((long)userData + 0x7c);
    if (fVar2 <= (float)(int)aspectRatio / (float)(int)targetRatio) {
      if (fVar2 < (float)(int)aspectRatio / (float)(int)targetRatio) {
        aspectRatio = (float)(int)((float)(int)targetRatio * fVar2);
      }
    }
    else {
      targetRatio = (float)(int)((float)(int)aspectRatio / fVar2);
    }
  }
  GVar1 = resizeWindow((_GLFWwindow *)userData,(int)aspectRatio,(int)targetRatio);
  if ((GVar1 != 0) &&
     (_glfwInputWindowSize
                ((_GLFWwindow *)userData,*(int *)((long)userData + 0x358),
                 *(int *)((long)userData + 0x35c)), *(int *)((long)userData + 0x368) != 0)) {
    _glfwInputWindowDamage((_GLFWwindow *)userData);
  }
  if ((*(int *)((long)userData + 0x368) == 0) &&
     ((*(long *)((long)userData + 0x3c8) == 0 || (*(int *)((long)userData + 0x3d0) != 0)))) {
    *(undefined4 *)((long)userData + 0x368) = 1;
    _glfwInputWindowDamage((_GLFWwindow *)userData);
  }
  return;
}

Assistant:

static void xdgSurfaceHandleConfigure(void* userData,
                                      struct xdg_surface* surface,
                                      uint32_t serial)
{
    _GLFWwindow* window = userData;

    xdg_surface_ack_configure(surface, serial);

    if (window->wl.activated != window->wl.pending.activated)
    {
        window->wl.activated = window->wl.pending.activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                xdg_toplevel_set_minimized(window->wl.xdg.toplevel);
        }
    }

    if (window->wl.maximized != window->wl.pending.maximized)
    {
        window->wl.maximized = window->wl.pending.maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = window->wl.pending.fullscreen;

    int width  = window->wl.pending.width;
    int height = window->wl.pending.height;

    if (!window->wl.maximized && !window->wl.fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);

        if (window->wl.visible)
            _glfwInputWindowDamage(window);
    }

    if (!window->wl.visible)
    {
        // Allow the window to be mapped only if it either has no XDG
        // decorations or they have already received a configure event
        if (!window->wl.xdg.decoration || window->wl.xdg.decorationMode)
        {
            window->wl.visible = GLFW_TRUE;
            _glfwInputWindowDamage(window);
        }
    }
}